

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# limits.cpp
# Opt level: O3

bool __thiscall
glslang::TInductiveTraverser::visitBinary
          (TInductiveTraverser *this,TVisit param_1,TIntermBinary *node)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  undefined4 extraout_var_00;
  long *plVar5;
  undefined8 *puVar6;
  undefined4 extraout_var_01;
  
  bVar2 = TIntermOperator::modifiesState(&node->super_TIntermOperator);
  if (bVar2) {
    iVar3 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x32])(node);
    lVar4 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x60))
                      ((long *)CONCAT44(extraout_var,iVar3));
    if (lVar4 != 0) {
      iVar3 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                [0x32])(node);
      plVar5 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x60))
                                 ((long *)CONCAT44(extraout_var_00,iVar3));
      lVar4 = (**(code **)(*plVar5 + 0x180))(plVar5);
      if (lVar4 == this->loopId) {
        this->bad = true;
        iVar3 = (**(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                   _vptr_TIntermNode)(node);
        puVar6 = (undefined8 *)CONCAT44(extraout_var_01,iVar3);
        uVar1 = puVar6[1];
        (this->badLoc).name = (TString *)*puVar6;
        (this->badLoc).string = (int)uVar1;
        (this->badLoc).line = (int)((ulong)uVar1 >> 0x20);
        *(undefined8 *)&(this->badLoc).column = puVar6[2];
      }
    }
  }
  return true;
}

Assistant:

bool TInductiveTraverser::visitBinary(TVisit /* visit */, TIntermBinary* node)
{
    if (node->modifiesState() && node->getLeft()->getAsSymbolNode() &&
                                 node->getLeft()->getAsSymbolNode()->getId() == loopId) {
        bad = true;
        badLoc = node->getLoc();
    }

    return true;
}